

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_bf16.h
# Opt level: O1

void ncnn::cast_bf16_to_fp32_sse_avx2(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  int iVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  
  iVar1 = bottom_blob->c;
  if (0 < (long)iVar1) {
    uVar3 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar5 = 0;
    do {
      pauVar6 = (undefined1 (*) [16])
                (bottom_blob->cstep * lVar5 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar7 = (undefined1 (*) [16])
                (top_blob->cstep * lVar5 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar3 < 8) {
        uVar9 = 0;
      }
      else {
        iVar8 = 7;
        do {
          auVar2 = vpunpcklwd_avx((undefined1  [16])0x0,*pauVar6);
          auVar11 = vpunpckhwd_avx((undefined1  [16])0x0,*pauVar6);
          pauVar7[1] = auVar11;
          *pauVar7 = auVar2;
          pauVar6 = pauVar6 + 1;
          pauVar7 = pauVar7 + 2;
          iVar8 = iVar8 + 8;
          uVar9 = uVar3 & 0xfffffff8;
        } while (iVar8 < (int)uVar3);
      }
      uVar4 = uVar9 | 3;
      while ((int)uVar4 < (int)uVar3) {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)*pauVar6;
        auVar11 = vpunpcklwd_avx((undefined1  [16])0x0,auVar11);
        *pauVar7 = auVar11;
        pauVar6 = (undefined1 (*) [16])(*pauVar6 + 8);
        pauVar7 = pauVar7 + 1;
        uVar4 = uVar9 + 7;
        uVar9 = uVar9 + 4;
      }
      if (uVar3 - uVar9 != 0 && (int)uVar9 <= (int)uVar3) {
        lVar10 = 0;
        do {
          *(uint *)(*pauVar7 + lVar10 * 4) = (uint)*(ushort *)(*pauVar6 + lVar10 * 2) << 0x10;
          lVar10 = lVar10 + 1;
        } while (uVar3 - uVar9 != (int)lVar10);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return;
}

Assistant:

static void cast_bf16_to_fp32_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_AVX512BF16 && __AVX512F__ && !__AVX512BF16__
    if (ncnn::cpu_support_x86_avx512_bf16())
    {
        cast_bf16_to_fp32_sse_avx512bf16(bottom_blob, top_blob, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        cast_bf16_to_fp32_sse_avx2(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const unsigned short* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            _mm512_storeu_ps(outptr, bfloat2float_avx512(_mm256_loadu_si256((const __m256i*)ptr)));
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            _mm256_storeu_ps(outptr, bfloat2float_avx(_mm_loadu_si128((const __m128i*)ptr)));
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            _mm_storeu_ps(outptr, bfloat2float_sse(_mm_loadl_epi64((const __m128i*)ptr)));
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr++ = bfloat16_to_float32(*ptr++);
        }
    }
}